

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  ExprList *pEVar1;
  int iVar2;
  char cVar3;
  ExprList_item *pEVar4;
  int iVar5;
  
  if (pList == (Window *)0x0) {
    return 0;
  }
LAB_0017c96c:
  pEVar1 = pList->pOrderBy;
  if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
    pEVar4 = pEVar1->a;
    iVar5 = pEVar1->nExpr + 1;
    do {
      iVar2 = sqlite3WalkExpr(pWalker,pEVar4->pExpr);
      if (iVar2 != 0) goto LAB_0017ca2e;
      pEVar4 = pEVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  pEVar1 = pList->pPartition;
  if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
    pEVar4 = pEVar1->a;
    iVar5 = pEVar1->nExpr + 1;
    do {
      iVar2 = sqlite3WalkExpr(pWalker,pEVar4->pExpr);
      if (iVar2 != 0) goto LAB_0017ca2e;
      pEVar4 = pEVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  if (pList->pFilter == (Expr *)0x0) {
LAB_0017c9f6:
    if (pList->pStart != (Expr *)0x0) {
      iVar5 = sqlite3WalkExprNN(pWalker,pList->pStart);
      cVar3 = '\x01';
      if (iVar5 != 0) goto LAB_0017ca33;
    }
    if (pList->pEnd != (Expr *)0x0) {
      iVar5 = sqlite3WalkExprNN(pWalker,pList->pEnd);
      cVar3 = '\x01';
      if (iVar5 != 0) goto LAB_0017ca33;
    }
    cVar3 = (bOneOnly != 0) * '\x02';
  }
  else {
    iVar5 = sqlite3WalkExprNN(pWalker,pList->pFilter);
    cVar3 = '\x01';
    if (iVar5 == 0) goto LAB_0017c9f6;
  }
  goto LAB_0017ca33;
LAB_0017ca2e:
  cVar3 = '\x01';
LAB_0017ca33:
  if (cVar3 != '\0') {
    if (cVar3 == '\x02') {
      return 0;
    }
    return 2;
  }
  pList = pList->pNextWin;
  if (pList == (Window *)0x0) {
    return 0;
  }
  goto LAB_0017c96c;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}